

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O2

void CreateIntegerTable(Connection *con,int64_t count)

{
  bool bVar1;
  allocator local_b1;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_b0;
  StringRef local_a8 [2];
  SourceLineInfo local_88;
  AssertionHandler catchAssertionHandler;
  StringRef local_30;
  
  local_a8[0].m_start = "REQUIRE";
  local_a8[0].m_size = 7;
  local_88.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sql/parallelism/interquery/test_concurrent_index.cpp"
  ;
  local_88.line = 0x14;
  Catch::StringRef::StringRef
            (&local_30,
             "NO_FAIL((con->Query(\"CREATE TABLE integers AS SELECT range AS i FROM range ($1)\", count)))"
            );
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,local_a8,&local_88,local_30,Normal);
  std::__cxx11::string::string
            ((string *)local_a8,"CREATE TABLE integers AS SELECT range AS i FROM range ($1)",
             &local_b1);
  duckdb::Connection::Query<long>((Connection *)&local_b0,(string *)con,(long)local_a8);
  bVar1 = duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)&local_b0);
  local_88.file = (char *)CONCAT71(local_88.file._1_7_,bVar1);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_88);
  if (local_b0._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_b0._M_head_impl + 8))();
  }
  local_b0._M_head_impl = (QueryResult *)0x0;
  std::__cxx11::string::~string((string *)local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

static void CreateIntegerTable(Connection *con, int64_t count) {
	REQUIRE_NO_FAIL(con->Query("CREATE TABLE integers AS SELECT range AS i FROM range ($1)", count));
}